

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

int __thiscall cppcms::http::request::on_content_progress(request *this,size_t n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _data *p_Var3;
  pointer pcVar4;
  basic_content_filter *pbVar5;
  multipart_parser *pmVar6;
  long *plVar7;
  byte *pbVar8;
  bool bVar9;
  parsing_result_type pVar10;
  uint uVar11;
  file *pfVar12;
  request *this_00;
  istream *piVar13;
  int iVar14;
  char *buffer_end;
  pointer psVar15;
  char *begin;
  string res;
  file_ptr f;
  files_type result;
  pointer local_f8;
  files_type *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  value_type local_c8;
  vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
  local_b8;
  string local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  if (n == 0) {
    return 0;
  }
  p_Var3 = (this->d).ptr_;
  pcVar4 = (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var3->read_size = p_Var3->read_size + n;
  local_f8 = pcVar4;
  if (p_Var3->filter_is_raw_content_filter == true) {
    (*p_Var3->filter->_vptr_basic_content_filter[4])
              (p_Var3->filter,
               (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,n);
  }
  p_Var3 = (this->d).ptr_;
  if ((p_Var3->multipart_parser).ptr_ == (multipart_parser *)0x0) goto LAB_001ca56b;
  local_f0 = (files_type *)content_limits::content_length_limit(&p_Var3->limits);
  buffer_end = pcVar4 + n;
  if (local_f8 != buffer_end) {
LAB_001ca3c2:
    pVar10 = cppcms::impl::multipart_parser::consume
                       ((((this->d).ptr_)->multipart_parser).ptr_,&local_f8,buffer_end);
    iVar14 = 0x19d;
    switch(pVar10) {
    case meta_ready:
      p_Var3 = (this->d).ptr_;
      if (p_Var3->filter_is_multipart_filter == true) {
        pfVar12 = cppcms::impl::multipart_parser::get_file((p_Var3->multipart_parser).ptr_);
        pbVar5 = ((this->d).ptr_)->filter;
        (*pbVar5->_vptr_basic_content_filter[4])(pbVar5,pfVar12);
      }
      goto switchD_001ca3f7_caseD_4;
    case content_partial:
      pfVar12 = cppcms::impl::multipart_parser::get_file((((this->d).ptr_)->multipart_parser).ptr_);
      bVar9 = size_ok(this,pfVar12,(longlong)local_f0);
      if (bVar9) {
        p_Var3 = (this->d).ptr_;
        if (p_Var3->filter_is_multipart_filter == true) {
          pbVar5 = p_Var3->filter;
          (*pbVar5->_vptr_basic_content_filter[5])(pbVar5,pfVar12);
        }
LAB_001ca4e9:
        if (bVar9 != false) goto switchD_001ca3f7_caseD_4;
      }
      break;
    case content_ready:
      pfVar12 = cppcms::impl::multipart_parser::last_file((((this->d).ptr_)->multipart_parser).ptr_)
      ;
      piVar13 = file::data(pfVar12);
      std::istream::seekg(piVar13,0,0);
      bVar9 = size_ok(this,pfVar12,(longlong)local_f0);
      if (bVar9) {
        p_Var3 = (this->d).ptr_;
        if (p_Var3->filter_is_multipart_filter == true) {
          pbVar5 = p_Var3->filter;
          (*pbVar5->_vptr_basic_content_filter[6])(pbVar5,pfVar12);
        }
        goto LAB_001ca4e9;
      }
      break;
    case continue_input:
      goto switchD_001ca3f7_caseD_4;
    case eof:
      iVar14 = 400;
      if ((local_f8 != buffer_end) ||
         (p_Var3 = (this->d).ptr_, p_Var3->read_size != p_Var3->content_length)) break;
switchD_001ca3f7_caseD_4:
      if (local_f8 == buffer_end) goto code_r0x001ca522;
      goto LAB_001ca3c2;
    case no_room_left:
      break;
    default:
      iVar14 = 400;
    }
    bVar9 = false;
    goto LAB_001ca563;
  }
  bVar9 = false;
LAB_001ca539:
  p_Var3 = (this->d).ptr_;
  bVar9 = (bool)(p_Var3->read_size != p_Var3->content_length | bVar9);
  iVar14 = 400;
  if (bVar9) {
    iVar14 = 0x19d;
  }
LAB_001ca563:
  if (!bVar9) {
    return iVar14;
  }
LAB_001ca56b:
  p_Var3 = (this->d).ptr_;
  if (p_Var3->read_size == p_Var3->content_length) {
    if (p_Var3->read_full == true) {
      this_00 = (request *)lazy_content_type(this);
      bVar9 = http::content_type::is_form_urlencoded((content_type *)this_00);
      if (bVar9) {
        p_Var3 = (this->d).ptr_;
        parse_form_urlencoded
                  (this_00,(p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                   (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&this->post_);
      }
    }
    else {
      pcVar4 = (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (p_Var3->post_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pcVar4 != (pointer)0x0) {
        operator_delete(pcVar4);
      }
    }
    pbVar5 = ((this->d).ptr_)->filter;
    if (pbVar5 != (basic_content_filter *)0x0) {
      (*pbVar5->_vptr_basic_content_filter[2])();
    }
    p_Var3 = (this->d).ptr_;
    pmVar6 = (p_Var3->multipart_parser).ptr_;
    if (pmVar6 != (multipart_parser *)0x0) {
      local_b8.
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pmVar6->files_).
           super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_b8.
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pmVar6->files_).
           super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_b8.
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pmVar6->files_).
           super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar6->files_).
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar6->files_).
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pmVar6->files_).
      super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      booster::hold_ptr<cppcms::impl::multipart_parser>::reset
                (&p_Var3->multipart_parser,(multipart_parser *)0x0);
      if (local_b8.
          super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&this->post_;
        paVar1 = &local_78.first.field_2;
        paVar2 = &local_78.second.field_2;
        local_f0 = &this->files_;
        psVar15 = local_b8.
                  super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (psVar15->super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (psVar15->super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar9 = file::has_mime(local_c8.
                                 super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
          if (bVar9) {
            std::
            vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
            ::push_back(local_f0,&local_c8);
          }
          else {
            file::name_abi_cxx11_
                      (&local_98,
                       local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            file::size(local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            piVar13 = file::data(local_c8.
                                 super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
            local_e8 = &local_d8;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            std::__cxx11::string::reserve((ulong)&local_e8);
            std::istream::seekg(piVar13,0,0);
            plVar7 = *(long **)(piVar13 + *(long *)(*(long *)piVar13 + -0x18) + 0xe8);
            while( true ) {
              pbVar8 = (byte *)plVar7[2];
              if (pbVar8 < (byte *)plVar7[3]) {
                uVar11 = (uint)*pbVar8;
                plVar7[2] = (long)(pbVar8 + 1);
              }
              else {
                uVar11 = (**(code **)(*plVar7 + 0x50))(plVar7);
              }
              if (uVar11 == 0xffffffff) break;
              std::__cxx11::string::push_back((char)&local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p == &local_98.field_2) {
              local_78.first.field_2._8_8_ = local_98.field_2._8_8_;
              local_78.first._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_78.first._M_dataplus._M_p = local_98._M_dataplus._M_p;
            }
            local_78.first.field_2._M_allocated_capacity._1_7_ =
                 local_98.field_2._M_allocated_capacity._1_7_;
            local_78.first.field_2._M_local_buf[0] = local_98.field_2._M_local_buf[0];
            local_78.first._M_string_length = local_98._M_string_length;
            local_98._M_string_length = 0;
            local_98.field_2._M_local_buf[0] = '\0';
            if (local_e8 == &local_d8) {
              local_78.second.field_2._8_8_ = local_d8._8_8_;
              local_78.second._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_78.second._M_dataplus._M_p = (pointer)local_e8;
            }
            local_78.second.field_2._M_allocated_capacity._1_7_ =
                 local_d8._M_allocated_capacity._1_7_;
            local_78.second.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
            local_78.second._M_string_length = local_e0;
            local_e0 = 0;
            local_d8._M_local_buf[0] = '\0';
            local_e8 = &local_d8;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      (local_38,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.second._M_dataplus._M_p != paVar2) {
              operator_delete(local_78.second._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.first._M_dataplus._M_p != paVar1) {
              operator_delete(local_78.first._M_dataplus._M_p);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
          }
          if (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          psVar15 = psVar15 + 1;
        } while (psVar15 !=
                 local_b8.
                 super__Vector_base<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::shared_ptr<cppcms::http::file>,_std::allocator<std::shared_ptr<cppcms::http::file>_>_>
      ::~vector(&local_b8);
    }
    ((this->d).ptr_)->ready = true;
  }
  return 0;
code_r0x001ca522:
  bVar9 = pVar10 == eof;
  goto LAB_001ca539;
}

Assistant:

int request::on_content_progress(size_t n)
{
	if(n==0)
		return 0;
	char const *begin = &d->post_data[0];
	char const *end = begin + n;
	d->read_size += n;
	try {
		if(d->filter_is_raw_content_filter) {
			static_cast<raw_content_filter *>(d->filter)->on_data_chunk(&d->post_data[0],n);
		}

		if(d->multipart_parser.get()) {
			multipart_parser::parsing_result_type r = multipart_parser::continue_input;

			long long allowed=d->limits.content_length_limit();

			while(begin!=end) {
				r = d->multipart_parser->consume(begin,end);
				
				switch(r) { 
				case multipart_parser::meta_ready: 	
					{
						if(d->filter_is_multipart_filter) { 
							file &f=d->multipart_parser->get_file();
							static_cast<multipart_filter *>(d->filter)->on_new_file(f); 
						}
					}
					break;
				case multipart_parser::content_partial:
					{
						file &f=d->multipart_parser->get_file();
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_upload_progress(f);
					}
					break;
				case multipart_parser::content_ready:	
					{
						file &f=d->multipart_parser->last_file();
						f.data().seekg(0);
						if(!size_ok(f,allowed))
							return 413;
						if(d->filter_is_multipart_filter)
							 static_cast<multipart_filter *>(d->filter)->on_data_ready(f);
					}
					break;
				case multipart_parser::continue_input:
					break;
				case multipart_parser::no_room_left:
					return 413;
				case multipart_parser::eof:
					if(begin!=end) 
						return 400;
					if(d->read_size != d->content_length) 
						return 400;
					break;
				case multipart_parser::parsing_error:
				default:
					return 400;
				}
			}
			if(begin==end && d->read_size==d->content_length && r!=multipart_parser::eof) {
				return 400;
			}
		}

		if(d->read_size == d->content_length) {
			if(d->read_full) {
				if(lazy_content_type().is_form_urlencoded()) {
					char const *data = &d->post_data[0];
					char const *data_end = data + d->post_data.size();
					parse_form_urlencoded(data,data_end,post_);
				}
			}
			else {
				std::vector<char> tmp;
				tmp.swap(d->post_data);
			}
			if(d->filter)
				d->filter->on_end_of_content();
			if(d->multipart_parser.get()) {
				multipart_parser::files_type mp=d->multipart_parser->get_files();
				d->multipart_parser.reset();
				
				for(multipart_parser::files_type::iterator p=mp.begin();p!=mp.end();++p) {
					multipart_parser::file_ptr f=*p;
					if(!f->has_mime()) 
						post_.insert(std::make_pair(f->name(),read_file(f->size(),f->data())));
					else 
						files_.push_back(f);
				}
			}
			d->ready = true;
		}
	}
	catch(abort_upload const &ab) {
		d->no_on_error=true;
		return ab.code();
	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms") << e.what() << booster::trace(e);
		d->no_on_error=true;
		return 500;
	}
	catch(...) {
		BOOSTER_ERROR("cppcms") << "Unknown exception ";
		d->no_on_error=true;
		return 500;
	}
	return 0;
}